

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

void update_mon(monster *mon,chunk *c,_Bool full)

{
  uint8_t uVar1;
  loc_conflict grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  _Bool _Var2;
  monster_lore_conflict *pmVar3;
  loc_conflict lVar4;
  monster_conflict *pmVar5;
  wchar_t local_70;
  wchar_t local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  object *obj;
  loc_conflict target;
  _Bool themed;
  _Bool telepathy_ok;
  _Bool easy;
  _Bool flag;
  loc_conflict pgrid;
  wchar_t dx;
  wchar_t dy;
  wchar_t d;
  monster_lore *lore;
  _Bool full_local;
  chunk *c_local;
  monster *mon_local;
  
  if (character_dungeon) {
    target.y = (player->grid).x;
    unique0x00012004 = (player->grid).y;
  }
  else {
    register0x00000000 = (loc_conflict)loc(c->width / 2,c->height / 2);
  }
  target.x._2_1_ = false;
  target.x._1_1_ = player_of_has(player,L'\r');
  uVar1 = player->themed_level;
  if (mon == (monster *)0x0) {
    __assert_fail("mon != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-util.c"
                  ,0x14a,"void update_mon(struct monster *, struct chunk *, _Bool)");
  }
  if (c == (chunk *)cave) {
    pmVar3 = get_lore(mon->race);
    if (full) {
      lVar4 = monster_target_loc(mon);
      obj._4_4_ = lVar4.y;
      if (obj._4_4_ - (mon->grid).y < 0) {
        local_54 = -(obj._4_4_ - (mon->grid).y);
      }
      else {
        local_54 = obj._4_4_ - (mon->grid).y;
      }
      obj._0_4_ = lVar4.x;
      if ((wchar_t)obj - (mon->grid).x < 0) {
        local_58 = -((wchar_t)obj - (mon->grid).x);
      }
      else {
        local_58 = (wchar_t)obj - (mon->grid).x;
      }
      if (local_58 < local_54) {
        local_5c = local_54 + (local_58 >> 1);
      }
      else {
        local_5c = local_58 + (local_54 >> 1);
      }
      dx._0_1_ = (uint8_t)local_5c;
      if (0xff < local_5c) {
        dx._0_1_ = 0xff;
      }
      mon->cdis = (uint8_t)dx;
      if ((mon->noise).grids != (uint16_t **)0x0) {
        make_noise((chunk_conflict *)c,(player *)0x0,(monster_conflict *)mon);
      }
      if ((mon->scent).grids != (uint16_t **)0x0) {
        update_scent((chunk_conflict *)c,(player *)0x0,(monster_conflict *)mon);
      }
    }
    if ((player->grid).y - (mon->grid).y < 0) {
      local_60 = -((player->grid).y - (mon->grid).y);
    }
    else {
      local_60 = (player->grid).y - (mon->grid).y;
    }
    if ((player->grid).x - (mon->grid).x < 0) {
      local_64 = -((player->grid).x - (mon->grid).x);
    }
    else {
      local_64 = (player->grid).x - (mon->grid).x;
    }
    if (local_64 < local_60) {
      local_68 = local_60 + (local_64 >> 1);
    }
    else {
      local_68 = local_64 + (local_60 >> 1);
    }
    if ((L'\0' < (mon->target).midx) &&
       (pmVar5 = cave_monster((chunk_conflict *)c,(mon->target).midx),
       pmVar5 == (monster_conflict *)0x0)) {
      (mon->target).midx = L'\0';
    }
    target.x._3_1_ = flag_has_dbg(mon->mflag,2,5,"mon->mflag","MFLAG_MARK");
    lVar4.x = (mon->grid).x;
    lVar4.y = (mon->grid).y;
    _Var2 = square_isno_esp(c,lVar4);
    if ((_Var2) || (_Var2 = square_isno_esp(c,stack0xffffffffffffffc4), _Var2)) {
      target.x._1_1_ = false;
    }
    if (uVar1 == '\0') {
      local_70 = (wchar_t)z_info->max_sight;
    }
    else {
      local_70 = z_info->max_sight / 2;
    }
    if (local_68 <= local_70) {
      if ((target.x._1_1_ != false) && (_Var2 = monster_is_esp_detectable(mon), _Var2)) {
        target.x._3_1_ = true;
        grid.x = (mon->grid).x;
        grid.y = (mon->grid).y;
        target.x._2_1_ = square_isview(c,grid);
      }
      grid_00.x = (mon->grid).x;
      grid_00.y = (mon->grid).y;
      _Var2 = square_isview(c,grid_00);
      if ((_Var2) && (player->timed[2] == 0)) {
        if (local_68 <= (player->state).see_infra) {
          flag_on_dbg(pmVar3->flags,0xc,0x34,"lore->flags","RF_COLD_BLOOD");
          _Var2 = flag_has_dbg(mon->race->flags,0xc,0x34,"mon->race->flags","RF_COLD_BLOOD");
          if (!_Var2) {
            target.x._3_1_ = true;
            target.x._2_1_ = true;
          }
        }
        grid_01.x = (mon->grid).x;
        grid_01.y = (mon->grid).y;
        _Var2 = square_isseen(c,grid_01);
        if (_Var2) {
          flag_on_dbg(pmVar3->flags,0xc,0x33,"lore->flags","RF_INVISIBLE");
          _Var2 = monster_is_invisible(mon);
          if (_Var2) {
            _Var2 = player_of_has(player,L'\x0e');
            if (_Var2) {
              target.x._3_1_ = true;
              target.x._2_1_ = true;
            }
          }
          else {
            target.x._3_1_ = true;
            target.x._2_1_ = true;
          }
        }
        grid_02.x = (mon->grid).x;
        grid_02.y = (mon->grid).y;
        path_analyse(c,grid_02);
      }
    }
    _Var2 = monster_is_mimicking(mon);
    if ((_Var2) && (_Var2 = ignore_item_ok(player,mon->mimicked_obj), _Var2)) {
      target.x._3_1_ = false;
      target.x._2_1_ = false;
    }
    if (target.x._3_1_ == false) {
      _Var2 = monster_is_visible(mon);
      if ((_Var2) &&
         ((mon->mimicked_obj == (object *)0x0 ||
          (_Var2 = ignore_item_ok(player,mon->mimicked_obj), _Var2)))) {
        flag_off(mon->mflag,2,6);
        square_light_spot(c,mon->grid);
        if (player->upkeep->health_who == mon) {
          player->upkeep->redraw = player->upkeep->redraw | 0x200;
        }
        player->upkeep->redraw = player->upkeep->redraw | 0x400000;
      }
    }
    else {
      if (target.x._1_1_ != false) {
        flags_set(pmVar3->flags,0xc,0x35,0x36,0x20,0x1f,0);
      }
      _Var2 = monster_is_visible(mon);
      if (!_Var2) {
        flag_on_dbg(mon->mflag,2,6,"mon->mflag","MFLAG_VISIBLE");
        square_light_spot(c,mon->grid);
        if (player->upkeep->health_who == mon) {
          player->upkeep->redraw = player->upkeep->redraw | 0x200;
        }
        if (pmVar3->sights < 0x7fff) {
          pmVar3->sights = pmVar3->sights + 1;
        }
        player->upkeep->redraw = player->upkeep->redraw | 0x400000;
      }
    }
    if (target.x._2_1_ == false) {
      _Var2 = monster_is_in_view(mon);
      if (_Var2) {
        flag_off(mon->mflag,2,1);
        if ((((player->opts).opt[10] & 1U) != 0) && (_Var2 = monster_is_camouflaged(mon), !_Var2)) {
          disturb(player);
        }
        player->upkeep->redraw = player->upkeep->redraw | 0x400000;
      }
    }
    else {
      _Var2 = monster_is_in_view(mon);
      if (!_Var2) {
        flag_on_dbg(mon->mflag,2,1,"mon->mflag","MFLAG_VIEW");
        if (((player->opts).opt[10] & 1U) != 0) {
          disturb(player);
        }
        player->upkeep->redraw = player->upkeep->redraw | 0x400000;
      }
    }
  }
  return;
}

Assistant:

void update_mon(struct monster *mon, struct chunk *c, bool full)
{
	struct monster_lore *lore;

	int d, dy, dx;

	/* If still generating the level, measure distances from the middle */
	struct loc pgrid = character_dungeon ? player->grid :
		loc(c->width / 2, c->height / 2);

	/* Seen at all */
	bool flag = false;

	/* Seen by vision */
	bool easy = false;

	/* ESP permitted */
	bool telepathy_ok = player_of_has(player, OF_TELEPATHY);

	/* Themed level */
	bool themed = player->themed_level ? true : false;

	assert(mon != NULL);

	/* Return if this is not the current level */
	if (c != cave) {
		return;
	}

	lore = get_lore(mon->race);
	
	/* Compute distance, or just use the current one; update any heatmaps */
	if (full) {
		/* Target */
		struct loc target = monster_target_loc(mon);

		/* Distance components */
		dy = ABS(target.y - mon->grid.y);
		dx = ABS(target.x - mon->grid.x);

		/* Approximate distance */
		d = (dy > dx) ? (dy + (dx >>  1)) : (dx + (dy >> 1));

		/* Restrict distance */
		if (d > 255) d = 255;

		/* Save the distance */
		mon->cdis = d;

		/* Heatmaps */
		if (mon->noise.grids) {
			make_noise(c, NULL, mon);
		}
		if (mon->scent.grids) {
			update_scent(c, NULL, mon);
		}
	}

	/* Get the actual distance from the player (mon->cdis is now
	 * the distance from the monster to its target) */
	dy = ABS(player->grid.y - mon->grid.y);
	dx = ABS(player->grid.x - mon->grid.x);
	d = (dy > dx) ? (dy + (dx >>  1)) : (dx + (dy >> 1));

	/* Remove any dead monster targets (then what happens? - NRM)*/
	if ((mon->target.midx > 0) && !cave_monster(c, mon->target.midx)) {
		mon->target.midx = 0;
	}

	/* Detected */
	if (mflag_has(mon->mflag, MFLAG_MARK)) flag = true;

	/* Check if telepathy works here */
	if (square_isno_esp(c, mon->grid) || square_isno_esp(c, pgrid)) {
		telepathy_ok = false;
	}

	/* Nearby */
	if (d <= (themed ? z_info->max_sight / 2 : z_info->max_sight)) {
		/* Basic telepathy */
		if (telepathy_ok && monster_is_esp_detectable(mon)) {
			/* Detectable */
			flag = true;

			/* Check for LOS so that MFLAG_VIEW is set later */
			if (square_isview(c, mon->grid)) easy = true;
		}

		/* Normal line of sight and player is not blind */
		if (square_isview(c, mon->grid) && !player->timed[TMD_BLIND]) {
			/* Use "infravision" */
			if (d <= player->state.see_infra) {
				/* Learn about warm/cold blood */
				rf_on(lore->flags, RF_COLD_BLOOD);

				/* Handle "warm blooded" monsters */
				if (!rf_has(mon->race->flags, RF_COLD_BLOOD)) {
					/* Easy to see */
					easy = flag = true;
				}
			}

			/* Use illumination */
			if (square_isseen(c, mon->grid)) {
				/* Learn about invisibility */
				rf_on(lore->flags, RF_INVISIBLE);

				/* Handle invisibility */
				if (monster_is_invisible(mon)) {
					/* See invisible */
					if (player_of_has(player, OF_SEE_INVIS)) {
						/* Easy to see */
						easy = flag = true;
					}
				} else {
					/* Easy to see */
					easy = flag = true;
				}
			}

			/* Learn about intervening squares */
			path_analyse(c, mon->grid);
		}
	}

	/* If a mimic looks like an ignored item, it's not seen */
	if (monster_is_mimicking(mon)) {
		struct object *obj = mon->mimicked_obj;
		if (ignore_item_ok(player, obj))
			easy = flag = false;
	}

	/* Is the monster is now visible? */
	if (flag) {
		/* Learn about the monster's mind */
		if (telepathy_ok) {
			flags_set(lore->flags, RF_SIZE, RF_EMPTY_MIND, RF_WEIRD_MIND,
					  RF_SMART, RF_STUPID, FLAG_END);
		}

		/* It was previously unseen */
		if (!monster_is_visible(mon)) {
			/* Mark as visible */
			mflag_on(mon->mflag, MFLAG_VISIBLE);

			/* Draw the monster */
			square_light_spot(c, mon->grid);

			/* Update health bar as needed */
			if (player->upkeep->health_who == mon)
				player->upkeep->redraw |= (PR_HEALTH);

			/* Hack -- Count "fresh" sightings */
			if (lore->sights < SHRT_MAX)
				lore->sights++;

			/* Window stuff */
			player->upkeep->redraw |= PR_MONLIST;
		}
	} else if (monster_is_visible(mon)) {
		/* Not visible but was previously seen - treat mimics differently */
		if (!mon->mimicked_obj
				|| ignore_item_ok(player, mon->mimicked_obj)) {
			/* Mark as not visible */
			mflag_off(mon->mflag, MFLAG_VISIBLE);

			/* Erase the monster */
			square_light_spot(c, mon->grid);

			/* Update health bar as needed */
			if (player->upkeep->health_who == mon)
				player->upkeep->redraw |= (PR_HEALTH);

			/* Window stuff */
			player->upkeep->redraw |= PR_MONLIST;
		}
	}


	/* Is the monster is now easily visible? */
	if (easy) {
		/* Change */
		if (!monster_is_in_view(mon)) {
			/* Mark as easily visible */
			mflag_on(mon->mflag, MFLAG_VIEW);

			/* Disturb on appearance */
			if (OPT(player, disturb_near))
				disturb(player);

			/* Re-draw monster window */
			player->upkeep->redraw |= PR_MONLIST;
		}
	} else {
		/* Change */
		if (monster_is_in_view(mon)) {
			/* Mark as not easily visible */
			mflag_off(mon->mflag, MFLAG_VIEW);

			/* Disturb on disappearance */
			if (OPT(player, disturb_near) && !monster_is_camouflaged(mon))
				disturb(player);

			/* Re-draw monster list window */
			player->upkeep->redraw |= PR_MONLIST;
		}
	}
}